

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::LoadableGetStateBlock_x
          (ChElementHexaANCF_3843 *this,int block_offset,ChState *mD)

{
  double *pdVar1;
  pointer psVar2;
  double *pdVar3;
  element_type *peVar4;
  long lVar5;
  Index index_31;
  Index index_28;
  Index index;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (block_offset < 0) goto LAB_006fc7ad;
  lVar5 = (mD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3;
  if (lVar5 < block_offset) goto LAB_006fc7ad;
  psVar2 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (mD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  peVar4 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  pdVar1 = pdVar3 + block_offset;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fb959;
  }
  else {
LAB_006fb959:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  uVar6 = (ulong)(uint)block_offset;
  if (lVar5 < (long)(uVar6 + 3)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 3;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fb9c8;
  }
  else {
LAB_006fb9c8:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 6)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 6;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fba3b;
  }
  else {
LAB_006fba3b:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x140);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x140);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 9)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 9;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fbaae;
  }
  else {
LAB_006fbaae:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->DDD_dt + uVar9 * 8 + 0xffffffffffffffe8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DDD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0xc)) goto LAB_006fc7ad;
  peVar4 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 0xc;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fbb25;
  }
  else {
LAB_006fbb25:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0xf)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0xf;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fbb92;
  }
  else {
LAB_006fbb92:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x12)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x12;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fbc08;
  }
  else {
LAB_006fbc08:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x140);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x140);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x15)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x15;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fbc7e;
  }
  else {
LAB_006fbc7e:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->DDD_dt + uVar9 * 8 + 0xffffffffffffffe8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DDD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x18)) goto LAB_006fc7ad;
  peVar4 = psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 0x18;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fbcf8;
  }
  else {
LAB_006fbcf8:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x1b)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x1b;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fbd68;
  }
  else {
LAB_006fbd68:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x1e)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x1e;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fbdde;
  }
  else {
LAB_006fbdde:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x140);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x140);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x21)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x21;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fbe54;
  }
  else {
LAB_006fbe54:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->DDD_dt + uVar9 * 8 + 0xffffffffffffffe8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DDD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x24)) goto LAB_006fc7ad;
  peVar4 = psVar2[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 0x24;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fbece;
  }
  else {
LAB_006fbece:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x27)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x27;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fbf3e;
  }
  else {
LAB_006fbf3e:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x2a)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x2a;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fbfb4;
  }
  else {
LAB_006fbfb4:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x140);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x140);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x2d)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x2d;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc02a;
  }
  else {
LAB_006fc02a:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->DDD_dt + uVar9 * 8 + 0xffffffffffffffe8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DDD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x30)) goto LAB_006fc7ad;
  peVar4 = psVar2[4].super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 0x30;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc0a4;
  }
  else {
LAB_006fc0a4:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x33)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x33;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc114;
  }
  else {
LAB_006fc114:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x36)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x36;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc18a;
  }
  else {
LAB_006fc18a:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x140);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x140);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x39)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x39;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc200;
  }
  else {
LAB_006fc200:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->DDD_dt + uVar9 * 8 + 0xffffffffffffffe8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DDD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x3c)) goto LAB_006fc7ad;
  peVar4 = psVar2[5].super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 0x3c;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc27a;
  }
  else {
LAB_006fc27a:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x3f)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x3f;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc2ea;
  }
  else {
LAB_006fc2ea:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x42)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x42;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc360;
  }
  else {
LAB_006fc360:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x140);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x140);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x45)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x45;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc3d6;
  }
  else {
LAB_006fc3d6:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->DDD_dt + uVar9 * 8 + 0xffffffffffffffe8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DDD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x48)) goto LAB_006fc7ad;
  peVar4 = psVar2[6].super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 0x48;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc450;
  }
  else {
LAB_006fc450:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x4b)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x4b;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc4c0;
  }
  else {
LAB_006fc4c0:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x4e)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x4e;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc536;
  }
  else {
LAB_006fc536:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x140);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x140);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x51)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x51;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc5ac;
  }
  else {
LAB_006fc5ac:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->DDD_dt + uVar9 * 8 + 0xffffffffffffffe8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DDD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x54)) goto LAB_006fc7ad;
  peVar4 = psVar2[7].super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 0x54;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc626;
  }
  else {
LAB_006fc626:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x57)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x57;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc696;
  }
  else {
LAB_006fc696:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x5a)) goto LAB_006fc7ad;
  pdVar1 = pdVar3 + uVar6 + 0x5a;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_006fc70c;
  }
  else {
LAB_006fc70c:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x140);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x140);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x5d)) {
LAB_006fc7ad:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar3 = pdVar3 + uVar6 + 0x5d;
  uVar6 = 3;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 == 0) goto LAB_006fc78e;
  }
  uVar8 = 0;
  do {
    pdVar3[uVar8] = *(double *)((long)&peVar4->DDD_dt + uVar8 * 8 + 0xffffffffffffffe8);
    uVar8 = uVar8 + 1;
  } while (uVar6 != uVar8);
LAB_006fc78e:
  if (uVar6 < 3) {
    do {
      pdVar3[uVar6] = *(double *)((long)&peVar4->DDD_dt + uVar6 * 8 + 0xffffffffffffffe8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  return;
}

Assistant:

void ChElementHexaANCF_3843::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(block_offset + 3, 3) = m_nodes[0]->GetD().eigen();
    mD.segment(block_offset + 6, 3) = m_nodes[0]->GetDD().eigen();
    mD.segment(block_offset + 9, 3) = m_nodes[0]->GetDDD().eigen();

    mD.segment(block_offset + 12, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(block_offset + 15, 3) = m_nodes[1]->GetD().eigen();
    mD.segment(block_offset + 18, 3) = m_nodes[1]->GetDD().eigen();
    mD.segment(block_offset + 21, 3) = m_nodes[1]->GetDDD().eigen();

    mD.segment(block_offset + 24, 3) = m_nodes[2]->GetPos().eigen();
    mD.segment(block_offset + 27, 3) = m_nodes[2]->GetD().eigen();
    mD.segment(block_offset + 30, 3) = m_nodes[2]->GetDD().eigen();
    mD.segment(block_offset + 33, 3) = m_nodes[2]->GetDDD().eigen();

    mD.segment(block_offset + 36, 3) = m_nodes[3]->GetPos().eigen();
    mD.segment(block_offset + 39, 3) = m_nodes[3]->GetD().eigen();
    mD.segment(block_offset + 42, 3) = m_nodes[3]->GetDD().eigen();
    mD.segment(block_offset + 45, 3) = m_nodes[3]->GetDDD().eigen();

    mD.segment(block_offset + 48, 3) = m_nodes[4]->GetPos().eigen();
    mD.segment(block_offset + 51, 3) = m_nodes[4]->GetD().eigen();
    mD.segment(block_offset + 54, 3) = m_nodes[4]->GetDD().eigen();
    mD.segment(block_offset + 57, 3) = m_nodes[4]->GetDDD().eigen();

    mD.segment(block_offset + 60, 3) = m_nodes[5]->GetPos().eigen();
    mD.segment(block_offset + 63, 3) = m_nodes[5]->GetD().eigen();
    mD.segment(block_offset + 66, 3) = m_nodes[5]->GetDD().eigen();
    mD.segment(block_offset + 69, 3) = m_nodes[5]->GetDDD().eigen();

    mD.segment(block_offset + 72, 3) = m_nodes[6]->GetPos().eigen();
    mD.segment(block_offset + 75, 3) = m_nodes[6]->GetD().eigen();
    mD.segment(block_offset + 78, 3) = m_nodes[6]->GetDD().eigen();
    mD.segment(block_offset + 81, 3) = m_nodes[6]->GetDDD().eigen();

    mD.segment(block_offset + 84, 3) = m_nodes[7]->GetPos().eigen();
    mD.segment(block_offset + 87, 3) = m_nodes[7]->GetD().eigen();
    mD.segment(block_offset + 90, 3) = m_nodes[7]->GetDD().eigen();
    mD.segment(block_offset + 93, 3) = m_nodes[7]->GetDDD().eigen();
}